

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SATSolver.hpp
# Opt level: O0

void __thiscall
SAT::PrimitiveProofRecordingSATSolver::PrimitiveProofRecordingSATSolver
          (PrimitiveProofRecordingSATSolver *this)

{
  SATClause *this_00;
  SATInference *val;
  List<SAT::SATClause_*> *premises;
  SATSolverWithAssumptions *in_RDI;
  undefined8 in_stack_ffffffffffffffb8;
  uint lits;
  size_t in_stack_ffffffffffffffc0;
  PropInference *this_01;
  SATLiteralStack *pSVar1;
  
  lits = (uint)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  SATSolverWithAssumptions::SATSolverWithAssumptions(in_RDI);
  (in_RDI->super_SATSolver)._vptr_SATSolver =
       (_func_int **)&PTR__PrimitiveProofRecordingSATSolver_013212b8;
  in_RDI[1].super_SATSolver._vptr_SATSolver = (_func_int **)0x0;
  pSVar1 = &in_RDI[1]._failedAssumptionBuffer;
  this_00 = (SATClause *)SATClause::operator_new(in_stack_ffffffffffffffc0,lits);
  SATClause::SATClause(this_00,(uint)((ulong)pSVar1 >> 0x20));
  pSVar1->_capacity = (size_t)this_00;
  this_01 = (PropInference *)&in_RDI[1]._failedAssumptionBuffer._stack;
  val = (SATInference *)PropInference::operator_new(0xa9ab5e);
  premises = Lib::List<SAT::SATClause_*>::empty();
  PropInference::PropInference(this_01,premises);
  (this_01->super_SATInference)._vptr_SATInference = (_func_int **)val;
  SATClause::setInference((SATClause *)in_RDI,val);
  return;
}

Assistant:

PrimitiveProofRecordingSATSolver() :
    _addedClauses(0), _refutation(new(0) SATClause(0)), _refutationInference(new PropInference(SATClauseList::empty()))
    {
      _refutation->setInference(_refutationInference);
    }